

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
* vkt::memory::anon_unknown_0::createHostCommand
            (MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
             *__return_storage_ptr__,Op op,Random *rng,Usage usage,VkSharingMode sharing)

{
  deUint32 dVar1;
  VkBufferUsageFlags usage_00;
  VkImageUsageFlags usage_01;
  Map *this;
  UnMap *this_00;
  Flush *this_01;
  Invalidate *this_02;
  HostMemoryAccess *pHVar2;
  CreateBuffer *this_03;
  DestroyBuffer *this_04;
  BindBufferMemory *this_05;
  CreateImage *this_06;
  DestroyImage *this_07;
  BindImageMemory *this_08;
  QueueWaitIdle *this_09;
  DeviceWaitIdle *this_10;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_44;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_43;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_42;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_41;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_40;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3f;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3e;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3d;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3c;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3b;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_3a;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_39;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_38;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_37;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_36;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Command> local_35 [13];
  VkSharingMode local_28;
  Usage local_24;
  VkSharingMode sharing_local;
  Usage usage_local;
  Random *rng_local;
  MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
  *pMStack_10;
  Op op_local;
  
  local_28 = sharing;
  local_24 = usage;
  _sharing_local = rng;
  rng_local._4_4_ = op;
  pMStack_10 = __return_storage_ptr__;
  switch(op) {
  case OP_MAP:
    this = (Map *)operator_new(0x18);
    Map::Map(this);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(local_35);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this);
    break;
  case OP_FLUSH:
    this_00 = (UnMap *)operator_new(0x10);
    UnMap::UnMap(this_00);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_36);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_00);
    break;
  case OP_MAP_FLUSH:
    this_01 = (Flush *)operator_new(0x18);
    Flush::Flush(this_01);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_37);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_01);
    break;
  case OP_MAP_INVALIDATE:
    this_02 = (Invalidate *)operator_new(0x18);
    Invalidate::Invalidate(this_02);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_38);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_02);
    break;
  case OP_MAP_READ:
    pHVar2 = (HostMemoryAccess *)operator_new(0x30);
    dVar1 = de::Random::getUint32(_sharing_local);
    HostMemoryAccess::HostMemoryAccess(pHVar2,true,false,dVar1);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_39);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,pHVar2);
    break;
  case OP_INVALIDATE:
    pHVar2 = (HostMemoryAccess *)operator_new(0x30);
    dVar1 = de::Random::getUint32(_sharing_local);
    HostMemoryAccess::HostMemoryAccess(pHVar2,false,true,dVar1);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3a);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,pHVar2);
    break;
  case OP_MAP_MODIFY:
    pHVar2 = (HostMemoryAccess *)operator_new(0x30);
    dVar1 = de::Random::getUint32(_sharing_local);
    HostMemoryAccess::HostMemoryAccess(pHVar2,true,true,dVar1);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3b);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,pHVar2);
    break;
  case OP_BUFFER_CREATE:
    this_03 = (CreateBuffer *)operator_new(0x10);
    usage_00 = usageToBufferUsageFlags(local_24);
    CreateBuffer::CreateBuffer(this_03,usage_00,local_28);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3c);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_03);
    break;
  case OP_BUFFER_DESTROY:
    this_04 = (DestroyBuffer *)operator_new(0x28);
    DestroyBuffer::DestroyBuffer(this_04);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3d);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_04);
    break;
  case OP_BUFFER_BINDMEMORY:
    this_05 = (BindBufferMemory *)operator_new(8);
    BindBufferMemory::BindBufferMemory(this_05);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3e);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_05);
    break;
  case OP_LAST:
    this_09 = (QueueWaitIdle *)operator_new(8);
    QueueWaitIdle::QueueWaitIdle(this_09);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_42);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_09);
    break;
  case OP_DEVICE_WAIT_FOR_IDLE:
    this_10 = (DeviceWaitIdle *)operator_new(8);
    DeviceWaitIdle::DeviceWaitIdle(this_10);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_43);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_10);
    break;
  default:
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_44);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,0);
    break;
  case OP_IMAGE_CREATE:
    this_06 = (CreateImage *)operator_new(0x18);
    usage_01 = usageToImageUsageFlags(local_24);
    CreateImage::CreateImage(this_06,usage_01,local_28);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_3f);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_06);
    break;
  case OP_IMAGE_DESTROY:
    this_07 = (DestroyImage *)operator_new(0x28);
    DestroyImage::DestroyImage(this_07);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_40);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_07);
    break;
  case OP_IMAGE_BINDMEMORY:
    this_08 = (BindImageMemory *)operator_new(8);
    BindImageMemory::BindImageMemory(this_08);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>::DefaultDeleter(&local_41);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::Command,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Command>_>
    ::MovePtr(__return_storage_ptr__,this_08);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Command> createHostCommand (Op					op,
										de::Random&			rng,
										Usage				usage,
										vk::VkSharingMode	sharing)
{
	switch (op)
	{
		case OP_MAP:					return de::MovePtr<Command>(new Map());
		case OP_UNMAP:					return de::MovePtr<Command>(new UnMap());

		case OP_MAP_FLUSH:				return de::MovePtr<Command>(new Flush());
		case OP_MAP_INVALIDATE:			return de::MovePtr<Command>(new Invalidate());

		case OP_MAP_READ:				return de::MovePtr<Command>(new HostMemoryAccess(true, false, rng.getUint32()));
		case OP_MAP_WRITE:				return de::MovePtr<Command>(new HostMemoryAccess(false, true, rng.getUint32()));
		case OP_MAP_MODIFY:				return de::MovePtr<Command>(new HostMemoryAccess(true, true, rng.getUint32()));

		case OP_BUFFER_CREATE:			return de::MovePtr<Command>(new CreateBuffer(usageToBufferUsageFlags(usage), sharing));
		case OP_BUFFER_DESTROY:			return de::MovePtr<Command>(new DestroyBuffer());
		case OP_BUFFER_BINDMEMORY:		return de::MovePtr<Command>(new BindBufferMemory());

		case OP_IMAGE_CREATE:			return de::MovePtr<Command>(new CreateImage(usageToImageUsageFlags(usage), sharing));
		case OP_IMAGE_DESTROY:			return de::MovePtr<Command>(new DestroyImage());
		case OP_IMAGE_BINDMEMORY:		return de::MovePtr<Command>(new BindImageMemory());

		case OP_QUEUE_WAIT_FOR_IDLE:	return de::MovePtr<Command>(new QueueWaitIdle());
		case OP_DEVICE_WAIT_FOR_IDLE:	return de::MovePtr<Command>(new DeviceWaitIdle());

		default:
			DE_FATAL("Unknown op");
			return de::MovePtr<Command>(DE_NULL);
	}
}